

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Cof(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nFanLim;
  uint uVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  int iVar4;
  uint local_40;
  uint local_3c;
  
  local_3c = 0;
  Extra_UtilGetoptReset();
  local_40 = 0;
  nFanLim = 0;
LAB_0027964d:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"VLvh"), iVar4 = globalUtilOptind, iVar1 == 0x4c) {
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-L\" should be followed by an integer.\n";
      goto LAB_0027971d;
    }
    nFanLim = atoi(argv[globalUtilOptind]);
    uVar2 = nFanLim;
joined_r0x002796bc:
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar2 < 0) {
LAB_00279729:
      Abc_Print(-2,"usage: &cof [-VL num] [-vh]\n");
      Abc_Print(-2,"\t         performs cofactoring w.r.t. variable(s)\n");
      Abc_Print(-2,"\t-V num : the zero-based ID of one variable to cofactor [default = %d]\n",
                (ulong)local_40);
      Abc_Print(-2,"\t-L num : cofactor vars with fanout count higher than this [default = %d]\n",
                (ulong)nFanLim);
      pcVar3 = "yes";
      if (local_3c == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar4 = -2;
LAB_002797b2:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  if (iVar1 == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      pcVar3 = "Abc_CommandAbc9Cof(): There is no AIG.\n";
      iVar4 = -1;
      goto LAB_002797b2;
    }
    if (nFanLim != 0) {
      Abc_Print(-1,"Cofactoring all variables whose fanout count is higher than %d.\n",
                (ulong)nFanLim);
      pNew = Gia_ManDupCofAll(pAbc->pGia,nFanLim,local_3c);
LAB_0027980e:
      Abc_FrameUpdateGia(pAbc,pNew);
      return 0;
    }
    if (local_40 != 0) {
      Abc_Print(-1,"Cofactoring one variable with object ID %d.\n",(ulong)local_40);
      pNew = Gia_ManDupCof(pAbc->pGia,local_40);
      goto LAB_0027980e;
    }
    local_40 = 0;
    pcVar3 = "One of the parameters, -V <num> or -L <num>, should be set on the command line.\n";
    nFanLim = 0;
  }
  else {
    if (iVar1 == 0x76) {
      local_3c = local_3c ^ 1;
      goto LAB_0027964d;
    }
    if (iVar1 != 0x56) goto LAB_00279729;
    if (globalUtilOptind < argc) {
      local_40 = atoi(argv[globalUtilOptind]);
      uVar2 = local_40;
      goto joined_r0x002796bc;
    }
    pcVar3 = "Command line switch \"-V\" should be followed by an integer.\n";
  }
LAB_0027971d:
  Abc_Print(-1,pcVar3);
  goto LAB_00279729;
}

Assistant:

int Abc_CommandAbc9Cof( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, fVerbose = 0;
    int iVar = 0, nLimFan = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "VLvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by an integer.\n" );
                goto usage;
            }
            iVar = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iVar < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLimFan = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLimFan < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cof(): There is no AIG.\n" );
        return 1;
    }
    if ( nLimFan )
    {
        Abc_Print( -1, "Cofactoring all variables whose fanout count is higher than %d.\n", nLimFan );
        pTemp = Gia_ManDupCofAll( pAbc->pGia, nLimFan, fVerbose );
        Abc_FrameUpdateGia( pAbc, pTemp );
    }
    else if ( iVar )
    {
        Abc_Print( -1, "Cofactoring one variable with object ID %d.\n", iVar );
        pTemp = Gia_ManDupCof( pAbc->pGia, iVar );
        Abc_FrameUpdateGia( pAbc, pTemp );
    }
    else
    {
        Abc_Print( -1, "One of the parameters, -V <num> or -L <num>, should be set on the command line.\n" );
        goto usage;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &cof [-VL num] [-vh]\n" );
    Abc_Print( -2, "\t         performs cofactoring w.r.t. variable(s)\n" );
    Abc_Print( -2, "\t-V num : the zero-based ID of one variable to cofactor [default = %d]\n", iVar );
    Abc_Print( -2, "\t-L num : cofactor vars with fanout count higher than this [default = %d]\n", nLimFan );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}